

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::Petition
          (CommissionerSafe *this,PetitionHandler *aHandler,string *aAddr,uint16_t aPort)

{
  _func_void *p_Var1;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  CommissionerSafe *local_80;
  _Any_data local_78;
  long local_68;
  undefined8 uStack_60;
  string local_58 [32];
  uint16_t local_38;
  
  local_80 = this;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
              *)&local_78,aHandler);
  std::__cxx11::string::string(local_58,(string *)aAddr);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_38 = aPort;
  p_Var1 = (_func_void *)operator_new(0x50);
  *(CommissionerSafe **)p_Var1 = local_80;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = uStack_60;
  if (local_68 != 0) {
    *(void **)(p_Var1 + 8) = local_78._M_unused._M_object;
    *(undefined8 *)(p_Var1 + 0x10) = local_78._8_8_;
    *(long *)(p_Var1 + 0x18) = local_68;
    local_68 = 0;
    uStack_60 = 0;
  }
  std::__cxx11::string::string((string *)(p_Var1 + 0x28),local_58);
  *(uint16_t *)(p_Var1 + 0x48) = local_38;
  pcStack_90 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:193:22)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:193:22)>
             ::_M_manager;
  local_a8._M_unused._0_8_ = (undefined8)p_Var1;
  PushAsyncRequest(this,(AsyncRequest *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  Petition(std::function<void(std::__cxx11::string_const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)
  ::$_0::~__0((__0 *)&local_80);
  return;
}

Assistant:

void CommissionerSafe::Petition(PetitionHandler aHandler, const std::string &aAddr, uint16_t aPort)
{
    PushAsyncRequest([=]() { mImpl->Petition(aHandler, aAddr, aPort); });
}